

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O1

void MULTILABEL::print_update(vw *all,bool is_test,example *ec)

{
  bool holdout_set_off;
  shared_data *psVar1;
  size_t current_pass;
  ulong uVar2;
  stringstream label_string;
  stringstream pred_string;
  string local_380;
  string local_360;
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  psVar1 = all->sd;
  if ((((double)psVar1->dump_interval <=
        psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    std::__cxx11::stringstream::stringstream(local_340);
    if (is_test) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330," unknown",8);
    }
    else if ((ec->l).cs.costs._end != (ec->l).cs.costs._begin) {
      uVar2 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)local_330);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin >> 2));
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    if ((ec->pred).scalars._end != (ec->pred).scalars._begin) {
      uVar2 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)(ec->pred).scalars._end - (long)(ec->pred).scalars._begin >> 2)
              );
    }
    psVar1 = all->sd;
    current_pass = all->current_pass;
    holdout_set_off = all->holdout_set_off;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    shared_data::print_update
              (psVar1,holdout_set_off,current_pass,&local_360,&local_380,ec->num_features,
               all->progress_add,all->progress_arg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    stringstream label_string;
    if (is_test)
      label_string << " unknown";
    else
      for (size_t i = 0; i < ec.l.multilabels.label_v.size(); i++) label_string << " " << ec.l.multilabels.label_v[i];

    stringstream pred_string;
    for (size_t i = 0; i < ec.pred.multilabels.label_v.size(); i++)
      pred_string << " " << ec.pred.multilabels.label_v[i];

    all.sd->print_update(all.holdout_set_off, all.current_pass, label_string.str(), pred_string.str(), ec.num_features,
        all.progress_add, all.progress_arg);
  }
}